

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::HttpInputStream::Response> * __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Response>::operator=
          (ExceptionOr<kj::HttpInputStream::Response> *this,
          ExceptionOr<kj::HttpInputStream::Response> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::HttpInputStream::Response>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;